

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O0

ExprTree * __thiscall
PcodeCompile::createBitRange(PcodeCompile *this,SpecificSymbol *sym,uint4 bitoffset,uint4 numbits)

{
  AddrSpace *vt;
  VarnodeTpl *this_00;
  bool bVar1;
  int iVar2;
  const_type cVar3;
  undefined4 extraout_var;
  long lVar4;
  ConstTpl *pCVar5;
  PcodeCompile *pPVar6;
  uintb uVar7;
  undefined4 extraout_var_00;
  ConstTpl local_108;
  PcodeCompile *local_e8;
  ExprTree *res;
  uintb local_c0;
  uintb mask;
  PcodeCompile *pPStack_b0;
  uint4 insize;
  ExprTree *res_2;
  VarnodeTpl *truncvn;
  PcodeCompile *local_98;
  ExprTree *res_1;
  byte local_6a;
  byte local_69;
  uint local_68;
  bool truncneeded;
  uint uStack_64;
  bool maskneeded;
  uint4 truncshift;
  uint4 finalsize;
  VarnodeTpl *vn;
  string local_48 [8];
  string errmsg;
  uint local_24;
  uint4 numbits_local;
  uint4 bitoffset_local;
  SpecificSymbol *sym_local;
  PcodeCompile *this_local;
  
  std::__cxx11::string::string(local_48);
  if (numbits == 0) {
    std::__cxx11::string::operator=(local_48,"Size of bitrange is zero");
  }
  iVar2 = (*(sym->super_TripleSymbol).super_SleighSymbol._vptr_SleighSymbol[0xc])();
  _truncshift = (VarnodeTpl *)CONCAT44(extraout_var,iVar2);
  uStack_64 = numbits + 7 >> 3;
  local_68 = 0;
  local_69 = (numbits & 7) != 0;
  local_6a = 1;
  lVar4 = std::__cxx11::string::size();
  if (((lVar4 == 0) && (bitoffset == 0)) && ((local_69 & 1) == 0)) {
    pCVar5 = VarnodeTpl::getSpace(_truncshift);
    cVar3 = ConstTpl::getType(pCVar5);
    if ((cVar3 == handle) &&
       (bVar1 = VarnodeTpl::isZeroSize(_truncshift), this_00 = _truncshift, bVar1)) {
      ConstTpl::ConstTpl((ConstTpl *)&res_1,real,(ulong)uStack_64);
      VarnodeTpl::setSize(this_00,(ConstTpl *)&res_1);
      this_local = (PcodeCompile *)operator_new(0x10);
      ExprTree::ExprTree((ExprTree *)this_local,_truncshift);
      local_98 = this_local;
      goto LAB_00718ead;
    }
  }
  lVar4 = std::__cxx11::string::size();
  if ((lVar4 == 0) &&
     (res_2 = (ExprTree *)buildTruncatedVarnode(this,_truncshift,bitoffset,numbits),
     (VarnodeTpl *)res_2 != (VarnodeTpl *)0x0)) {
    pPVar6 = (PcodeCompile *)operator_new(0x10);
    ExprTree::ExprTree((ExprTree *)pPVar6,(VarnodeTpl *)res_2);
    pPStack_b0 = pPVar6;
    if (_truncshift != (VarnodeTpl *)0x0) {
      operator_delete(_truncshift);
    }
    this_local = pPStack_b0;
  }
  else {
    pCVar5 = VarnodeTpl::getSize(_truncshift);
    cVar3 = ConstTpl::getType(pCVar5);
    if (cVar3 == real) {
      pCVar5 = VarnodeTpl::getSize(_truncshift);
      uVar7 = ConstTpl::getReal(pCVar5);
      mask._4_4_ = (uint)uVar7;
      if (mask._4_4_ != 0) {
        local_6a = uStack_64 < mask._4_4_;
        mask._4_4_ = mask._4_4_ << 3;
        if ((mask._4_4_ <= bitoffset) || (mask._4_4_ < bitoffset + numbits)) {
          std::__cxx11::string::operator=(local_48,"Bitrange is bad");
        }
        if (((local_69 & 1) != 0) && (bitoffset + numbits == mask._4_4_)) {
          local_69 = 0;
        }
      }
    }
    local_c0 = (2L << ((char)numbits - 1U & 0x3f)) - 1;
    local_24 = bitoffset;
    if (((local_6a & 1) != 0) && ((bitoffset & 7) == 0)) {
      local_68 = bitoffset >> 3;
      local_24 = 0;
    }
    if (((local_24 == 0) && ((local_6a & 1) == 0)) && ((local_69 & 1) == 0)) {
      std::__cxx11::string::operator=(local_48,"Superfluous bitrange");
    }
    if (((local_69 & 1) != 0) && (8 < uStack_64)) {
      SleighSymbol::getName_abi_cxx11_((SleighSymbol *)sym);
      std::operator+((char *)&res,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "Illegal masked bitrange producing varnode larger than 64 bits: ");
      std::__cxx11::string::operator=(local_48,(string *)&res);
      std::__cxx11::string::~string((string *)&res);
    }
    pPVar6 = (PcodeCompile *)operator_new(0x10);
    ExprTree::ExprTree((ExprTree *)pPVar6,_truncshift);
    local_e8 = pPVar6;
    lVar4 = std::__cxx11::string::size();
    if (lVar4 == 0) {
      if (local_24 != 0) {
        appendOp(this,CPUI_INT_RIGHT,(ExprTree *)local_e8,(ulong)local_24,4);
      }
      if ((local_6a & 1) != 0) {
        appendOp(this,CPUI_SUBPIECE,(ExprTree *)local_e8,(ulong)local_68,4);
      }
      if ((local_69 & 1) != 0) {
        appendOp(this,CPUI_INT_AND,(ExprTree *)local_e8,local_c0,uStack_64);
      }
      vt = local_e8->defaultspace;
      ConstTpl::ConstTpl(&local_108,real,(ulong)uStack_64);
      force_size((VarnodeTpl *)vt,&local_108,
                 (vector<OpTpl_*,_std::allocator<OpTpl_*>_> *)local_e8->_vptr_PcodeCompile);
      this_local = local_e8;
    }
    else {
      iVar2 = (*this->_vptr_PcodeCompile[4])(this,sym);
      (*this->_vptr_PcodeCompile[5])(this,CONCAT44(extraout_var_00,iVar2),local_48);
      this_local = local_e8;
    }
  }
LAB_00718ead:
  truncvn._4_4_ = 1;
  std::__cxx11::string::~string(local_48);
  return (ExprTree *)this_local;
}

Assistant:

ExprTree *PcodeCompile::createBitRange(SpecificSymbol *sym,uint4 bitoffset,uint4 numbits)

{ // Create an expression computing the indicated bitrange of sym
  // The result is truncated to the smallest byte size that can
  // contain the indicated number of bits. The result has the
  // desired bits shifted all the way to the right
  string errmsg;
  if (numbits == 0)
    errmsg = "Size of bitrange is zero";
  VarnodeTpl *vn = sym->getVarnode();
  uint4 finalsize = (numbits+7)/8; // Round up to neareast byte size
  uint4 truncshift = 0;
  bool maskneeded = ((numbits%8)!=0);
  bool truncneeded = true;

  // Special case where we can set the size, without invoking
  // a truncation operator
  if ((errmsg.size()==0)&&(bitoffset==0)&&(!maskneeded)) {
    if ((vn->getSpace().getType()==ConstTpl::handle)&&vn->isZeroSize()) {
      vn->setSize(ConstTpl(ConstTpl::real,finalsize));
      ExprTree *res = new ExprTree(vn);
      //      VarnodeTpl *cruft = buildTemporary();
      //      delete cruft;
      return res;
    }
  }

  if (errmsg.size()==0) {
    VarnodeTpl *truncvn = buildTruncatedVarnode(vn,bitoffset,numbits);
    if (truncvn != (VarnodeTpl *)0) { // If we are able to construct a simple truncated varnode
      ExprTree *res = new ExprTree(truncvn); // Return just the varnode as an expression
      delete vn;
      return res;
    }
  }

  if (vn->getSize().getType()==ConstTpl::real) {
    // If we know the size of the input varnode, we can
    // do some immediate checks, and possibly simplify things
    uint4 insize = vn->getSize().getReal();
    if (insize > 0) {
      truncneeded = (finalsize < insize);
      insize *= 8;		// Convert to number of bits
      if ((bitoffset >= insize)||(bitoffset+numbits > insize))
	errmsg = "Bitrange is bad";
      if (maskneeded && ((bitoffset+numbits)==insize))
	maskneeded = false;
    }
  }

  uintb mask = (uintb)2;
  mask = ((mask<<(numbits-1))-1);
  
  if (truncneeded && ((bitoffset % 8)==0)) {
    truncshift = bitoffset/8;
    bitoffset = 0;
  }

  if ((bitoffset==0)&&(!truncneeded)&&(!maskneeded))
    errmsg = "Superfluous bitrange";

  if (maskneeded && (finalsize > 8))
    errmsg = "Illegal masked bitrange producing varnode larger than 64 bits: " + sym->getName();

  ExprTree *res = new ExprTree(vn);

  if (errmsg.size()>0) {	// Check for error condition
    reportError(getLocation(sym), errmsg);
    return res;
  }

  if (bitoffset !=0)
    appendOp(CPUI_INT_RIGHT,res,bitoffset,4);
  if (truncneeded)
    appendOp(CPUI_SUBPIECE,res,truncshift,4);
  if (maskneeded)
    appendOp(CPUI_INT_AND,res,mask,finalsize);
  force_size(res->outvn,ConstTpl(ConstTpl::real,finalsize),*res->ops);
  return res;
}